

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::IThreadPool> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IThreadPool>::operator=
          (RefCntAutoPtr<Diligent::IThreadPool> *this,RefCntAutoPtr<Diligent::IThreadPool> *AutoPtr)

{
  IThreadPool *pObj;
  RefCntAutoPtr<Diligent::IThreadPool> *AutoPtr_local;
  RefCntAutoPtr<Diligent::IThreadPool> *this_local;
  
  if (this->m_pObject != AutoPtr->m_pObject) {
    pObj = Detach(AutoPtr);
    Attach(this,pObj);
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }